

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.h
# Opt level: O1

int __thiscall Group::build(Group *this,int *v,int vn,int c)

{
  pointer pBVar1;
  pointer pBVar2;
  pointer piVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  float fVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_fjzzq2002[P]MiniShader_group_h:26:21)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_fjzzq2002[P]MiniShader_group_h:26:21)>
  __comp_00;
  int local_bc;
  ulong local_b8;
  long local_b0;
  int *local_a8;
  ulong local_a0;
  long local_98;
  BoundingBox local_90;
  BoundingBox local_78;
  BoundingBox local_60;
  BoundingBox local_48;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  if (vn == 1) {
    iVar5 = *v;
  }
  else {
    local_a0 = (ulong)(uint)this->bn;
    this->bn = this->bn + 1;
    lVar9 = (long)vn;
    local_bc = c;
    if (vn != 0) {
      __comp._M_comp.c = &local_bc;
      __comp._M_comp.this = this;
      std::
      __introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_comp_iter<Group::build(int*,int,int)::_lambda(int,int)_1_>>
                (v,v + lVar9,(ulong)(uint)((int)LZCOUNT(lVar9) * 2) ^ 0x7e,__comp);
      __comp_00._M_comp.c = &local_bc;
      __comp_00._M_comp.this = this;
      std::
      __final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_comp_iter<Group::build(int*,int,int)::_lambda(int,int)_1_>>
                (v,v + lVar9,__comp_00);
    }
    pBVar1 = (this->t1).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_a8 = v;
    local_98 = lVar9;
    Vector3f::operator=(&pBVar1->a,&BoundingBox::EMPTY.a);
    Vector3f::operator=(&pBVar1->b,&BoundingBox::EMPTY.b);
    local_b8 = (ulong)(uint)vn;
    if (0 < vn) {
      local_b0 = local_b8 * 0x18;
      lVar9 = 0;
      piVar8 = local_a8;
      do {
        pBVar1 = (this->t1).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar5 = *piVar8;
        pBVar2 = (this->box).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
                 super__Vector_impl_data._M_start;
        Vector3f::Vector3f(&local_48.a,&pBVar2[iVar5].a);
        Vector3f::Vector3f(&local_48.b,&pBVar2[iVar5].b);
        BoundingBox::operator|
                  (&local_90,(BoundingBox *)((long)(pBVar1->a).m_elements + lVar9),&local_48);
        pBVar1 = (this->t1).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
                 super__Vector_impl_data._M_start;
        Vector3f::operator=((Vector3f *)((long)pBVar1[1].a.m_elements + lVar9),&local_90.a);
        Vector3f::operator=((Vector3f *)((long)pBVar1[1].b.m_elements + lVar9),&local_90.b);
        piVar8 = piVar8 + 1;
        lVar9 = lVar9 + 0x18;
      } while (local_b0 != lVar9);
    }
    lVar9 = local_98;
    pBVar1 = (this->t2).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
             super__Vector_impl_data._M_start;
    Vector3f::operator=(&pBVar1[local_98].a,&BoundingBox::EMPTY.a);
    Vector3f::operator=(&pBVar1[lVar9].b,&BoundingBox::EMPTY.b);
    if (0 < vn) {
      lVar9 = local_b8 + 1;
      lVar10 = local_b8 * 0x18;
      do {
        pBVar1 = (this->t2).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar5 = local_a8[lVar9 + -2];
        pBVar2 = (this->box).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
                 super__Vector_impl_data._M_start;
        Vector3f::Vector3f(&local_78.a,&pBVar2[iVar5].a);
        Vector3f::Vector3f(&local_78.b,&pBVar2[iVar5].b);
        BoundingBox::operator|
                  (&local_90,(BoundingBox *)((long)(pBVar1->a).m_elements + lVar10),&local_78);
        pBVar1 = (this->t2).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
                 super__Vector_impl_data._M_start;
        Vector3f::operator=((Vector3f *)((long)pBVar1[-1].a.m_elements + lVar10),&local_90.a);
        Vector3f::operator=((Vector3f *)((long)(&pBVar1->a + -1) + lVar10),&local_90.b);
        lVar9 = lVar9 + -1;
        lVar10 = lVar10 + -0x18;
      } while (1 < lVar9);
    }
    iVar5 = (int)local_a0;
    lVar9 = (long)(int)local_a0;
    iVar7 = vn / 2;
    fVar12 = BoundingBox::area((this->t1).
                               super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl
                               .super__Vector_impl_data._M_start + iVar7);
    local_b0 = CONCAT44(local_b0._4_4_,fVar12);
    auVar13._0_4_ =
         BoundingBox::area((this->t2).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>.
                           _M_impl.super__Vector_impl_data._M_start + iVar7);
    auVar13._4_60_ = extraout_var;
    if (1 < vn) {
      auVar4 = vmaxss_avx(auVar13._0_16_,ZEXT416((uint)(float)local_b0));
      lVar10 = local_b8 * 0x18;
      lVar11 = 0x18;
      iVar6 = 1;
      do {
        local_b0 = CONCAT44(local_b0._4_4_,auVar4._0_4_);
        fVar12 = BoundingBox::area((BoundingBox *)
                                   ((long)(((this->t1).
                                            super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->a).
                                          m_elements + lVar11));
        local_b8 = CONCAT44(local_b8._4_4_,fVar12);
        auVar14._0_4_ =
             BoundingBox::area((BoundingBox *)
                               ((long)(((this->t2).
                                        super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->a).m_elements +
                               lVar11));
        auVar14._4_60_ = extraout_var_00;
        auVar4 = vmaxss_avx(auVar14._0_16_,ZEXT416((uint)local_b8));
        if (auVar4._0_4_ < (float)local_b0) {
          iVar7 = iVar6;
        }
        auVar4 = vminss_avx(auVar4,ZEXT416((uint)(float)local_b0));
        lVar11 = lVar11 + 0x18;
        iVar6 = iVar6 + 1;
      } while (lVar10 != lVar11);
    }
    piVar8 = local_a8;
    iVar6 = build(this,local_a8,iVar7,local_bc + 1 + ((local_bc + 1) / 3) * -3);
    (this->ch).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar9 * 2] = iVar6;
    iVar7 = build(this,piVar8 + iVar7,vn - iVar7,local_bc + 1 + ((local_bc + 1) / 3) * -3);
    iVar6 = iVar5 * 2 + 1;
    piVar3 = (this->ch).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3[iVar6] = iVar7;
    iVar5 = piVar3[lVar9 * 2];
    pBVar1 = (this->box).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar7 = piVar3[iVar6];
    Vector3f::Vector3f(&local_60.a,&pBVar1[iVar7].a);
    Vector3f::Vector3f(&local_60.b,&pBVar1[iVar7].b);
    BoundingBox::operator|(&local_90,pBVar1 + iVar5,&local_60);
    pBVar1 = (this->box).super__Vector_base<BoundingBox,_std::allocator<BoundingBox>_>._M_impl.
             super__Vector_impl_data._M_start;
    Vector3f::operator=(&pBVar1[lVar9].a,&local_90.a);
    Vector3f::operator=(&pBVar1[lVar9].b,&local_90.b);
    iVar5 = (int)local_a0;
  }
  return iVar5;
}

Assistant:

int build(int* v,int vn,int c=0)
	{
//		cerr << vn << "!" << v[0] << "!!\n";
//		for (int j = 0; j < vn; ++j) cerr << v[j] << "|"; cerr << "EZ\n";
		if (vn == 1) return v[0];
		int p = bn++;
		std::sort(v,v+vn, [&](int p, int q) {return box[p].a[c] + box[p].b[c] < box[q].a[c] + box[q].b[c]; });
		t1[0] = BoundingBox::EMPTY;
		for (int i = 0; i < vn; ++i)
			t1[i+1] = t1[i] | box[v[i]];
		t2[vn] = BoundingBox::EMPTY;
		for (int i = vn - 1; i >= 0; --i)
			t2[i] = t2[i + 1] | box[v[i]];
		int I=vn/2;
		float mxx = std::max(t1[I].area(),t2[I].area());
		for (int i = 1; i < vn; ++i)
		{
			float ma = std::max(t1[i].area(), t2[i].area());
			if (ma < mxx) mxx = ma, I = i;
		}
		ch[p * 2] = build(v, I, (c+1)%3);
//		cerr << p << "FIRSTHALF ED\n";
		ch[p * 2 + 1] = build(v + I, vn - I,(c+1)%3);
		box[p] = box[ch[p * 2]] | box[ch[p * 2 + 1]];
		return p;
	}